

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imcompress.c
# Opt level: O1

int fits_shuffle_4bytes(char *heap,LONGLONG length,int *status)

{
  int extraout_EAX;
  int extraout_EAX_00;
  char *__src;
  long lVar1;
  char *pcVar2;
  char *pcVar3;
  
  __src = (char *)malloc(length * 4);
  if (__src != (char *)0x0) {
    if (0 < length) {
      lVar1 = 0;
      pcVar2 = heap;
      pcVar3 = __src;
      do {
        *pcVar3 = *pcVar2;
        pcVar3[length] = pcVar2[1];
        pcVar3[length * 2] = pcVar2[2];
        pcVar3[length * 3] = pcVar2[3];
        pcVar2 = pcVar2 + 4;
        pcVar3 = pcVar3 + 1;
        lVar1 = lVar1 + 1;
      } while (length != lVar1);
    }
    memcpy(heap,__src,length * 4);
    free(__src);
    return extraout_EAX;
  }
  ffpmsg("malloc failed\n");
  return extraout_EAX_00;
}

Assistant:

static int fits_shuffle_4bytes(char *heap, LONGLONG length, int *status)

/* shuffle the bytes in an array of 4-byte integers or floats  */

{
    LONGLONG ii;
    char *ptr, *cptr, *heapptr;
    
    ptr = malloc((size_t) (length * 4));
    if (!ptr) {
      ffpmsg("malloc failed\n");
      return(*status);
    }

    heapptr = heap;
    cptr = ptr;
 
    for (ii = 0; ii < length; ii++) {
       *cptr = *heapptr;
       heapptr++;
       *(cptr + length) = *heapptr;
       heapptr++;
       *(cptr + (length * 2)) = *heapptr;
       heapptr++;
       *(cptr + (length * 3)) = *heapptr;
       heapptr++;
       cptr++;
    }
        
    memcpy(heap, ptr, (size_t) (length * 4));
    free(ptr);

    return(*status);
}